

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  int iVar1;
  int iVar2;
  int i;
  long lVar3;
  vector<int,_std::allocator<int>_> inNums;
  vector<int,_std::allocator<int>_> outNums;
  consoleInput cIn;
  visualOutput vOu;
  consoleOutput cOut;
  listInput lIn;
  listOutput lOut;
  ifstream file;
  vector<int,_std::allocator<int>_> local_578;
  vector<int,_std::allocator<int>_> local_558;
  visualOutput *local_538;
  vector<int,_std::allocator<int>_> local_530;
  vector<int,_std::allocator<int>_> local_518;
  string local_500;
  string local_4e0;
  string local_4c0;
  string local_4a0;
  string local_480;
  consoleInput local_460;
  visualOutput local_3d0;
  consoleOutput local_368;
  listInput local_320;
  listOutput local_2b8;
  char local_230 [520];
  
  std::ifstream::ifstream(local_230);
  signal(0x1c,redrawSystem);
  if (1 < argc) {
    std::ifstream::open(local_230,(_Ios_Openmode)argv[1]);
  }
  setlocale(6,"");
  initscr();
  start_color();
  noecho();
  cbreak();
  mousemask(0xfffffff,0);
  keypad(_stdscr,1);
  init_pair(1,0,7);
  init_pair(2,0,2);
  init_pair(3,0,1);
  init_pair(4,0,3);
  init_pair(5,7,0);
  init_color(8,0xfa,0xfa,0xfa);
  init_color(9,500,500,500);
  init_pair(6,7,0);
  init_pair(7,7,8);
  init_pair(8,7,9);
  init_pair(9,7,7);
  init_pair(10,7,1);
  if (cursorVisible != false) {
    cursorVisible = false;
  }
  curs_set(cursorVisible);
  refresh();
  initSystem(2,2);
  local_578.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  local_578.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
       = (int *)0x0;
  local_578.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (int *)0x0;
  iVar2 = 0x14;
  do {
    iVar1 = rand();
    iVar1 = iVar1 % 500 + 100;
    local_460.super_input._vptr_input =
         (_func_int **)CONCAT44(local_460.super_input._vptr_input._4_4_,iVar1);
    if (local_578.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish ==
        local_578.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage) {
      std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                (&local_578,
                 (iterator)
                 local_578.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_finish,(int *)&local_460);
    }
    else {
      *local_578.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
       _M_finish = iVar1;
      local_578.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish = local_578.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_finish + 1;
    }
    iVar2 = iVar2 + -1;
  } while (iVar2 != 0);
  local_480._M_dataplus._M_p = (pointer)&local_480.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_480,"IN.A","");
  std::vector<int,_std::allocator<int>_>::vector(&local_518,&local_578);
  listInput::listInput(&local_320,0x80,1,&local_480,0x14,&local_518);
  if (local_518.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_518.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_518.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_518.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_480._M_dataplus._M_p != &local_480.field_2) {
    operator_delete(local_480._M_dataplus._M_p,local_480.field_2._M_allocated_capacity + 1);
  }
  listInput::initArrow(&local_320,'\0','\0');
  local_460.super_input._vptr_input = (_func_int **)&local_320;
  if (inputs.super__Vector_base<input_*,_std::allocator<input_*>_>._M_impl.super__Vector_impl_data.
      _M_finish ==
      inputs.super__Vector_base<input_*,_std::allocator<input_*>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage) {
    std::vector<input*,std::allocator<input*>>::_M_realloc_insert<input*>
              ((vector<input*,std::allocator<input*>> *)&inputs,
               (iterator)
               inputs.super__Vector_base<input_*,_std::allocator<input_*>_>._M_impl.
               super__Vector_impl_data._M_finish,(input **)&local_460);
  }
  else {
    *inputs.super__Vector_base<input_*,_std::allocator<input_*>_>._M_impl.super__Vector_impl_data.
     _M_finish = &local_320.super_input;
    inputs.super__Vector_base<input_*,_std::allocator<input_*>_>._M_impl.super__Vector_impl_data.
    _M_finish = inputs.super__Vector_base<input_*,_std::allocator<input_*>_>._M_impl.
                super__Vector_impl_data._M_finish + 1;
  }
  local_558.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  local_558.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
       = (int *)0x0;
  local_558.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (int *)0x0;
  lVar3 = 0;
  do {
    local_460.super_input._vptr_input =
         (_func_int **)
         CONCAT44(local_460.super_input._vptr_input._4_4_,
                  local_578.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start[lVar3] % 10);
    if (local_558.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish ==
        local_558.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage) {
      std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                (&local_558,
                 (iterator)
                 local_558.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_finish,(int *)&local_460);
    }
    else {
      *local_558.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
       _M_finish = local_578.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start[lVar3] % 10;
      local_558.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish = local_558.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_finish + 1;
    }
    lVar3 = lVar3 + 1;
  } while (lVar3 != 0x14);
  local_4a0._M_dataplus._M_p = (pointer)&local_4a0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_4a0,"OU.A","");
  std::vector<int,_std::allocator<int>_>::vector(&local_530,&local_558);
  listOutput::listOutput(&local_2b8,0x80,0x19,&local_4a0,0x14,&local_530);
  if (local_530.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_530.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_530.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_530.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4a0._M_dataplus._M_p != &local_4a0.field_2) {
    operator_delete(local_4a0._M_dataplus._M_p,local_4a0.field_2._M_allocated_capacity + 1);
  }
  listOutput::initArrow(&local_2b8,'\x0f','\x02');
  local_460.super_input._vptr_input = (_func_int **)&local_2b8;
  if (outputs.super__Vector_base<output_*,_std::allocator<output_*>_>._M_impl.
      super__Vector_impl_data._M_finish ==
      outputs.super__Vector_base<output_*,_std::allocator<output_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<output*,std::allocator<output*>>::_M_realloc_insert<output*>
              ((vector<output*,std::allocator<output*>> *)&outputs,
               (iterator)
               outputs.super__Vector_base<output_*,_std::allocator<output_*>_>._M_impl.
               super__Vector_impl_data._M_finish,(output **)&local_460);
  }
  else {
    *outputs.super__Vector_base<output_*,_std::allocator<output_*>_>._M_impl.super__Vector_impl_data
     ._M_finish = &local_2b8.super_output;
    outputs.super__Vector_base<output_*,_std::allocator<output_*>_>._M_impl.super__Vector_impl_data.
    _M_finish = outputs.super__Vector_base<output_*,_std::allocator<output_*>_>._M_impl.
                super__Vector_impl_data._M_finish + 1;
  }
  local_4c0._M_dataplus._M_p = (pointer)&local_4c0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_4c0,"OU.B","");
  consoleOutput::consoleOutput(&local_368,0x91,0x19,&local_4c0,0x14);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4c0._M_dataplus._M_p != &local_4c0.field_2) {
    operator_delete(local_4c0._M_dataplus._M_p,local_4c0.field_2._M_allocated_capacity + 1);
  }
  consoleOutput::initArrow(&local_368,'\x0e','\x02');
  local_460.super_input._vptr_input = (_func_int **)&local_368;
  if (outputs.super__Vector_base<output_*,_std::allocator<output_*>_>._M_impl.
      super__Vector_impl_data._M_finish ==
      outputs.super__Vector_base<output_*,_std::allocator<output_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<output*,std::allocator<output*>>::_M_realloc_insert<output*>
              ((vector<output*,std::allocator<output*>> *)&outputs,
               (iterator)
               outputs.super__Vector_base<output_*,_std::allocator<output_*>_>._M_impl.
               super__Vector_impl_data._M_finish,(output **)&local_460);
  }
  else {
    *outputs.super__Vector_base<output_*,_std::allocator<output_*>_>._M_impl.super__Vector_impl_data
     ._M_finish = &local_368.super_output;
    outputs.super__Vector_base<output_*,_std::allocator<output_*>_>._M_impl.super__Vector_impl_data.
    _M_finish = outputs.super__Vector_base<output_*,_std::allocator<output_*>_>._M_impl.
                super__Vector_impl_data._M_finish + 1;
  }
  local_4e0._M_dataplus._M_p = (pointer)&local_4e0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_4e0,"IN.B","");
  consoleInput::consoleInput(&local_460,0x91,1,&local_4e0,0x12);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4e0._M_dataplus._M_p != &local_4e0.field_2) {
    operator_delete(local_4e0._M_dataplus._M_p,local_4e0.field_2._M_allocated_capacity + 1);
  }
  consoleInput::initArrow(&local_460,'\x01','\0');
  if (inputs.super__Vector_base<input_*,_std::allocator<input_*>_>._M_impl.super__Vector_impl_data.
      _M_finish ==
      inputs.super__Vector_base<input_*,_std::allocator<input_*>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage) {
    local_3d0.super_output._vptr_output = (_func_int **)&local_460;
    std::vector<input*,std::allocator<input*>>::_M_realloc_insert<input*>
              ((vector<input*,std::allocator<input*>> *)&inputs,
               (iterator)
               inputs.super__Vector_base<input_*,_std::allocator<input_*>_>._M_impl.
               super__Vector_impl_data._M_finish,(input **)&local_3d0);
  }
  else {
    *inputs.super__Vector_base<input_*,_std::allocator<input_*>_>._M_impl.super__Vector_impl_data.
     _M_finish = &local_460.super_input;
    inputs.super__Vector_base<input_*,_std::allocator<input_*>_>._M_impl.super__Vector_impl_data.
    _M_finish = inputs.super__Vector_base<input_*,_std::allocator<input_*>_>._M_impl.
                super__Vector_impl_data._M_finish + 1;
  }
  local_3d0.super_output._vptr_output = (_func_int **)&local_460.super_runtimeInput;
  if (runtimeInputs.super__Vector_base<runtimeInput_*,_std::allocator<runtimeInput_*>_>._M_impl.
      super__Vector_impl_data._M_finish ==
      runtimeInputs.super__Vector_base<runtimeInput_*,_std::allocator<runtimeInput_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<runtimeInput*,std::allocator<runtimeInput*>>::_M_realloc_insert<runtimeInput*>
              ((vector<runtimeInput*,std::allocator<runtimeInput*>> *)&runtimeInputs,
               (iterator)
               runtimeInputs.super__Vector_base<runtimeInput_*,_std::allocator<runtimeInput_*>_>.
               _M_impl.super__Vector_impl_data._M_finish,(runtimeInput **)&local_3d0);
  }
  else {
    *runtimeInputs.super__Vector_base<runtimeInput_*,_std::allocator<runtimeInput_*>_>._M_impl.
     super__Vector_impl_data._M_finish = (runtimeInput *)local_3d0.super_output._vptr_output;
    runtimeInputs.super__Vector_base<runtimeInput_*,_std::allocator<runtimeInput_*>_>._M_impl.
    super__Vector_impl_data._M_finish =
         runtimeInputs.super__Vector_base<runtimeInput_*,_std::allocator<runtimeInput_*>_>._M_impl.
         super__Vector_impl_data._M_finish + 1;
  }
  local_500._M_dataplus._M_p = (pointer)&local_500.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_500,"OU.C","");
  visualOutput::visualOutput(&local_3d0,0x9b,0x19,&local_500,0x24,0x16);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_500._M_dataplus._M_p != &local_500.field_2) {
    operator_delete(local_500._M_dataplus._M_p,local_500.field_2._M_allocated_capacity + 1);
  }
  visualOutput::initArrow(&local_3d0,'\r','\x02');
  local_538 = &local_3d0;
  if (outputs.super__Vector_base<output_*,_std::allocator<output_*>_>._M_impl.
      super__Vector_impl_data._M_finish ==
      outputs.super__Vector_base<output_*,_std::allocator<output_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<output*,std::allocator<output*>>::_M_realloc_insert<output*>
              ((vector<output*,std::allocator<output*>> *)&outputs,
               (iterator)
               outputs.super__Vector_base<output_*,_std::allocator<output_*>_>._M_impl.
               super__Vector_impl_data._M_finish,(output **)&local_538);
  }
  else {
    *outputs.super__Vector_base<output_*,_std::allocator<output_*>_>._M_impl.super__Vector_impl_data
     ._M_finish = &local_3d0.super_output;
    outputs.super__Vector_base<output_*,_std::allocator<output_*>_>._M_impl.super__Vector_impl_data.
    _M_finish = outputs.super__Vector_base<output_*,_std::allocator<output_*>_>._M_impl.
                super__Vector_impl_data._M_finish + 1;
  }
  state = 1;
  endwin();
  while( true ) {
    while( true ) {
      while (state == 1) {
        drawSystemContent();
        editLoop();
      }
      if (state != 2) break;
      runtimeLoop();
    }
    if (state == 0) break;
    state = 1;
  }
  endwin();
  local_3d0.super_output._vptr_output = (_func_int **)&PTR_takeValue_00114d40;
  if (local_3d0.in.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_3d0.in.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_3d0.in.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_3d0.in.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  local_3d0.super_output._vptr_output = (_func_int **)&PTR_takeValue_00114c68;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3d0.super_output.lbl._M_dataplus._M_p != &local_3d0.super_output.lbl.field_2) {
    operator_delete(local_3d0.super_output.lbl._M_dataplus._M_p,
                    local_3d0.super_output.lbl.field_2._M_allocated_capacity + 1);
  }
  local_460.super_input._vptr_input = (_func_int **)&PTR_loadValue_001149d8;
  local_460.super_runtimeInput._vptr_runtimeInput = (_func_int **)&PTR_processInput_00114a20;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_460.inStr._M_dataplus._M_p != &local_460.inStr.field_2) {
    operator_delete(local_460.inStr._M_dataplus._M_p,
                    local_460.inStr.field_2._M_allocated_capacity + 1);
  }
  local_460.super_input._vptr_input = (_func_int **)&PTR_loadValue_00114c20;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_460.super_input.lbl._M_dataplus._M_p != &local_460.super_input.lbl.field_2) {
    operator_delete(local_460.super_input.lbl._M_dataplus._M_p,
                    local_460.super_input.lbl.field_2._M_allocated_capacity + 1);
  }
  local_368.super_output._vptr_output = (_func_int **)&PTR_takeValue_00114c68;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_368.super_output.lbl._M_dataplus._M_p != &local_368.super_output.lbl.field_2) {
    operator_delete(local_368.super_output.lbl._M_dataplus._M_p,
                    local_368.super_output.lbl.field_2._M_allocated_capacity + 1);
  }
  local_2b8.super_output._vptr_output = (_func_int **)&PTR_takeValue_00114cf8;
  if (local_2b8.outputStorage.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_2b8.outputStorage.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_2b8.outputStorage.super__Vector_base<int,_std::allocator<int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_2b8.outputStorage.super__Vector_base<int,_std::allocator<int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_2b8.numStorage.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_2b8.numStorage.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_2b8.numStorage.super__Vector_base<int,_std::allocator<int>_>._M_impl
                          .super__Vector_impl_data._M_end_of_storage -
                    (long)local_2b8.numStorage.super__Vector_base<int,_std::allocator<int>_>._M_impl
                          .super__Vector_impl_data._M_start);
  }
  local_2b8.super_output._vptr_output = (_func_int **)&PTR_takeValue_00114c68;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2b8.super_output.lbl._M_dataplus._M_p != &local_2b8.super_output.lbl.field_2) {
    operator_delete(local_2b8.super_output.lbl._M_dataplus._M_p,
                    local_2b8.super_output.lbl.field_2._M_allocated_capacity + 1);
  }
  if (local_558.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_558.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_558.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_558.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  local_320.super_input._vptr_input = (_func_int **)&PTR_loadValue_00114ca8;
  if (local_320.numStorage.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_320.numStorage.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_320.numStorage.super__Vector_base<int,_std::allocator<int>_>._M_impl
                          .super__Vector_impl_data._M_end_of_storage -
                    (long)local_320.numStorage.super__Vector_base<int,_std::allocator<int>_>._M_impl
                          .super__Vector_impl_data._M_start);
  }
  local_320.super_input._vptr_input = (_func_int **)&PTR_loadValue_00114c20;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_320.super_input.lbl._M_dataplus._M_p != &local_320.super_input.lbl.field_2) {
    operator_delete(local_320.super_input.lbl._M_dataplus._M_p,
                    local_320.super_input.lbl.field_2._M_allocated_capacity + 1);
  }
  if (local_578.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_578.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_578.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_578.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  std::ifstream::~ifstream(local_230);
  return 0;
}

Assistant:

int main(int argc, char *argv[]){
  std::ifstream file;

  
  signal(SIGWINCH, redrawSystem);

  if(argc>=2)
    file.open(argv[1]);
  
  setlocale(LC_ALL, "");
  initscr();
  start_color();
  
  noecho();
  cbreak();
  mousemask(ALL_MOUSE_EVENTS, NULL);
	keypad(stdscr, TRUE);

  init_pair(1, COLOR_BLACK, COLOR_WHITE);
  init_pair(2, COLOR_BLACK, COLOR_GREEN);
  init_pair(3, COLOR_BLACK, COLOR_RED);
  init_pair(4, COLOR_BLACK, COLOR_YELLOW);
  init_pair(5, COLOR_WHITE, COLOR_BLACK);

  init_color(COLOR_DARK_GREY, 250, 250, 250);
  init_color(COLOR_BRIGHT_GREY, 500, 500, 500);

  init_pair(6, COLOR_WHITE, COLOR_BLACK);
  init_pair(7, COLOR_WHITE, COLOR_DARK_GREY);
  init_pair(8, COLOR_WHITE, COLOR_BRIGHT_GREY);
  init_pair(9, COLOR_WHITE, COLOR_WHITE);
  init_pair(10, COLOR_WHITE, COLOR_RED);

  setCursor(false);

  refresh();

  initSystem(2, 2);
  
  
  // TEST INPUTS AND OUTPUTS
  
  vector<int> inNums;
  for (int i = 0; i < 20; i++) {
    inNums.push_back((rand() % 500) + 100);
  }
	
  listInput lIn = listInput(128, 1, "IN.A", 20, inNums);
  lIn.initArrow(0, 0);
  inputs.push_back(&lIn);
  
  vector<int> outNums;
  for (int i = 0; i < 20; i++) {
    outNums.push_back(inNums[i] % 10);
  }
  
  listOutput lOut = listOutput(128, 25, "OU.A", 20, outNums);
  lOut.initArrow(15, 2);
  outputs.push_back(&lOut);
  
  consoleOutput cOut = consoleOutput(145, 25, "OU.B", 20);
  cOut.initArrow(14, 2);
  outputs.push_back(&cOut);
  
  consoleInput cIn = consoleInput(145, 1, "IN.B", 18);
  cIn.initArrow(1, 0);
  inputs.push_back(&cIn);
  runtimeInputs.push_back(&cIn);

  visualOutput vOu = visualOutput(155, 25, "OU.C", 36, 22);
  vOu.initArrow(13, 2);
  outputs.push_back(&vOu);
	  
  state = EDIT;

  endwin();
  while (state != OFF) {
  	switch(state) {
  		case EDIT:
  			redrawContent();
  			editLoop();
  			break;
  		case RUNNING:
  			runtimeLoop();
  			break;
  		default:
  			state = EDIT;
  	}
  }

  endwin();
  return 0;
}